

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm.c
# Opt level: O0

void send_and_maybe_wait_for_handshake(CManager_conflict cm,CMConnection conn)

{
  int iVar1;
  __pid_t _Var2;
  long lVar3;
  pthread_t pVar4;
  long *in_RSI;
  long in_RDI;
  timespec ts_2;
  timespec ts_1;
  timespec ts;
  int actual;
  int msg [5];
  int reliable;
  FFSEncodeVec tmp_vec [1];
  CMConnection in_stack_ffffffffffffff58;
  CManager in_stack_ffffffffffffff60;
  FILE *pFVar5;
  undefined8 in_stack_ffffffffffffff70;
  int condition;
  CManager in_stack_ffffffffffffff78;
  __time_t local_80;
  undefined4 local_78;
  CMTraceType in_stack_ffffffffffffff8c;
  CManager in_stack_ffffffffffffff90;
  long local_68;
  timespec local_60;
  int local_4c;
  undefined4 local_48;
  undefined4 local_44;
  undefined4 local_40;
  uint local_3c;
  undefined4 local_38;
  int local_2c;
  undefined4 *local_28;
  CMConnection conn_00;
  
  condition = (int)((ulong)in_stack_ffffffffffffff70 >> 0x20);
  local_2c = transport_is_reliable(in_stack_ffffffffffffff58);
  if (*(int *)(in_RDI + 0xb8) == 0) {
    *(undefined4 *)(in_RDI + 0xb8) = 0xffffffff;
  }
  local_48 = 0x434d4800;
  local_44 = 0x1000014;
  local_40 = *(undefined4 *)(in_RDI + 0xb8);
  local_3c = *(uint *)(in_RDI + 0x18);
  local_38 = 0;
  if ((int)in_RSI[7] != 0) {
    local_3c = local_3c | 0x80000000;
  }
  local_28 = &local_48;
  conn_00 = (CMConnection)&DAT_00000014;
  iVar1 = CMtrace_val[3];
  if (*(long *)(*in_RSI + 0x120) == 0) {
    iVar1 = CMtrace_init(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
  }
  if (iVar1 != 0) {
    if (CMtrace_PID != 0) {
      pFVar5 = *(FILE **)(*in_RSI + 0x120);
      _Var2 = getpid();
      in_stack_ffffffffffffff78 = (CManager)(long)_Var2;
      pVar4 = pthread_self();
      fprintf(pFVar5,"P%lxT%lx - ",in_stack_ffffffffffffff78,pVar4);
      condition = (int)((ulong)pFVar5 >> 0x20);
    }
    if (CMtrace_timing != 0) {
      clock_gettime(1,&local_60);
      fprintf(*(FILE **)(*in_RSI + 0x120),"%lld.%.9ld - ",local_60.tv_sec,local_60.tv_nsec);
    }
    fprintf(*(FILE **)(*in_RSI + 0x120),"CM - sending handshake\n");
  }
  fflush(*(FILE **)(*in_RSI + 0x120));
  if (((int)in_RSI[7] == 0) && (local_2c != 0)) {
    iVar1 = INT_CMCondition_get(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    *(int *)(in_RSI + 8) = iVar1;
  }
  local_4c = (**(code **)(in_RSI[1] + 0x78))(&CMstatic_trans_svcs,in_RSI[2],&local_28,1,0);
  iVar1 = CMtrace_val[3];
  if (*(long *)(*in_RSI + 0x120) == 0) {
    iVar1 = CMtrace_init(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
  }
  if (iVar1 != 0) {
    if (CMtrace_PID != 0) {
      pFVar5 = *(FILE **)(*in_RSI + 0x120);
      _Var2 = getpid();
      pVar4 = pthread_self();
      fprintf(pFVar5,"P%lxT%lx - ",(long)_Var2,pVar4);
    }
    if (CMtrace_timing != 0) {
      clock_gettime(1,(timespec *)&stack0xffffffffffffff90);
      fprintf(*(FILE **)(*in_RSI + 0x120),"%lld.%.9ld - ",in_stack_ffffffffffffff90,local_68);
    }
    fprintf(*(FILE **)(*in_RSI + 0x120),"CM - after handshake, pending is %d\n",
            (ulong)*(uint *)(in_RSI + 0x24));
  }
  fflush(*(FILE **)(*in_RSI + 0x120));
  if ((int)in_RSI[0x24] != 0) {
    wait_for_pending_write(conn_00);
  }
  if (local_4c != 1) {
    printf("handshake write failed\n");
  }
  if (((int)in_RSI[7] == 0) && (local_2c != 0)) {
    iVar1 = CMtrace_val[3];
    if (*(long *)(*in_RSI + 0x120) == 0) {
      iVar1 = CMtrace_init(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
    }
    if (iVar1 != 0) {
      if (CMtrace_PID != 0) {
        pFVar5 = *(FILE **)(*in_RSI + 0x120);
        _Var2 = getpid();
        lVar3 = (long)_Var2;
        pVar4 = pthread_self();
        fprintf(pFVar5,"P%lxT%lx - ",lVar3,pVar4);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,(timespec *)&local_80);
        fprintf(*(FILE **)(*in_RSI + 0x120),"%lld.%.9ld - ",local_80,
                CONCAT44(in_stack_ffffffffffffff8c,local_78));
      }
      fprintf(*(FILE **)(*in_RSI + 0x120),"CM - waiting for handshake response\n");
    }
    fflush(*(FILE **)(*in_RSI + 0x120));
    INT_CMCondition_wait(in_stack_ffffffffffffff78,condition);
  }
  return;
}

Assistant:

static
 void
 send_and_maybe_wait_for_handshake(CManager cm, CMConnection conn)
 {
     struct FFSEncodeVec tmp_vec[1];
     int reliable = transport_is_reliable(conn);
     int msg[5], actual;
     if (!cm->FFSserver_identifier) cm->FFSserver_identifier = -1;
     msg[0] = 0x434d4800;  /* CMH\0 */
     msg[1] = (CURRENT_HANDSHAKE_VERSION << 24) + sizeof(msg);
     msg[2] = cm->FFSserver_identifier;
     msg[3] = cm->CManager_ID;
     msg[4] = 0;  /* not implemented yet */
     if (conn->remote_format_server_ID != 0) {
	 /* set high bit if we already have his ID */
	 msg[3] |= 0x80000000;
     }
     tmp_vec[0].iov_base = &msg;
     tmp_vec[0].iov_len = sizeof(msg);
     CMtrace_out(conn->cm, CMLowLevelVerbose, "CM - sending handshake\n");
     if ((conn->remote_format_server_ID == 0) && reliable) {
	 /* we will await his respone */
	 conn->handshake_condition = INT_CMCondition_get(cm, conn);
     }
     actual = conn->trans->writev_func(&CMstatic_trans_svcs, 
				       conn->transport_data, 
				       &tmp_vec[0], 1, NULL);

     CMtrace_out(conn->cm, CMLowLevelVerbose, "CM - after handshake, pending is %d\n", conn->write_pending);
     if (conn->write_pending) {
	 wait_for_pending_write(conn);
     }
     if (actual != 1) {
	 printf("handshake write failed\n");
     }
     if ((conn->remote_format_server_ID == 0) && reliable) {
	 CMtrace_out(conn->cm, CMLowLevelVerbose, "CM - waiting for handshake response\n");
	 INT_CMCondition_wait(cm, conn->handshake_condition);
     }
 }